

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

Interval * __thiscall
tcu::FloatFormat::convert(Interval *__return_storage_ptr__,FloatFormat *this,Interval *x)

{
  double dVar1;
  double __x;
  double dVar2;
  double __x_00;
  Interval local_70;
  Interval local_58;
  Interval local_40;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar2 = x->m_lo;
  dVar1 = x->m_hi;
  if (x->m_hasNaN == true) {
    __x_00 = -INFINITY;
    if (this->m_hasNaN == NO) {
      __x = INFINITY;
    }
    else {
      local_40.m_hasNaN = true;
      local_40.m_lo = INFINITY;
      local_40.m_hi = -INFINITY;
      Interval::operator|=(__return_storage_ptr__,&local_40);
      __x = INFINITY;
      __x_00 = -INFINITY;
      if (this->m_hasNaN == YES) goto LAB_008d4f29;
    }
  }
  else {
LAB_008d4f29:
    __x = dVar1;
    __x_00 = dVar2;
    if (dVar1 < dVar2) goto LAB_008d4fd5;
  }
  dVar2 = round(this,__x_00);
  clampValue(&local_58,this,dVar2);
  dVar2 = round(this,__x);
  clampValue(&local_70,this,dVar2);
  local_40.m_hasNaN = (bool)1;
  if (local_58.m_hasNaN == false) {
    local_40.m_hasNaN = local_70.m_hasNaN;
  }
  local_40.m_lo =
       (double)(~-(ulong)(local_58.m_lo <= local_70.m_lo) & (ulong)local_70.m_lo |
               (ulong)local_58.m_lo & -(ulong)(local_58.m_lo <= local_70.m_lo));
  local_40.m_hi =
       (double)(~-(ulong)(local_70.m_hi <= local_58.m_hi) & (ulong)local_70.m_hi |
               (ulong)local_58.m_hi & -(ulong)(local_70.m_hi <= local_58.m_hi));
  Interval::operator|=(__return_storage_ptr__,&local_40);
LAB_008d4fd5:
  if (this->m_exactPrecision == false) {
    Interval::operator|=(__return_storage_ptr__,x);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::convert (const Interval& x) const
{
	Interval ret;
	Interval tmp = x;

	if (x.hasNaN())
	{
		// If NaN might be supported, NaN is a legal return value
		if (m_hasNaN != NO)
			ret |= TCU_NAN;

		// If NaN might not be supported, any (non-NaN) value is legal,
		// _subject_ to clamping. Hence we modify tmp, not ret.
		if (m_hasNaN != YES)
			tmp = Interval::unbounded();
	}

	// Round both bounds _inwards_ to closest representable values.
	if (!tmp.empty())
		ret |= clampValue(round(tmp.lo(), true)) | clampValue(round(tmp.hi(), false));

	// If this format's precision is not exact, the (possibly out-of-bounds)
	// original value is also a possible result.
	if (!m_exactPrecision)
		ret |= x;

	return ret;
}